

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
          (SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *this,TypeBase **key,
          FunctionData **value)

{
  Node *pNVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  int iVar6;
  
  pTVar3 = *key;
  if (pTVar3 == (TypeBase *)0x0) {
    __assertion = "key != Key()";
    uVar4 = 0x3b;
  }
  else {
    uVar4 = this->bucketCount;
    if (uVar4 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar4 = this->bucketCount;
      pTVar3 = *key;
    }
    uVar5 = pTVar3->nameHash;
    for (iVar6 = 1; iVar6 - uVar4 != 1; iVar6 = iVar6 + 1) {
      uVar5 = uVar5 & uVar4 - 1;
      pNVar1 = this->data + uVar5;
      pTVar2 = this->data[uVar5].key;
      if (pTVar2 == (TypeBase *)0x0) {
        pNVar1->key = pTVar3;
        pNVar1->value = *value;
        this->count = this->count + 1;
        return;
      }
      if (pTVar2 == pTVar3) {
        pNVar1->value = *value;
        return;
      }
      uVar5 = uVar5 + iVar6;
    }
    __assertion = "!\"couldn\'t insert node\"";
    uVar4 = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar4,
                "void SmallDenseMap<TypeBase *, FunctionData *, TypeBaseHasher, 32>::insert(const Key &, const Value &) [Key = TypeBase *, Value = FunctionData *, Hasher = TypeBaseHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}